

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O0

void __thiscall Js::ActivationObjectEx::InvalidateCachedScope(ActivationObjectEx *this)

{
  ScriptFunction *this_00;
  ActivationObjectEx *this_local;
  
  if (this->cachedFuncCount != 0) {
    memset(this->cache,0,(ulong)this->cachedFuncCount << 4);
  }
  this_00 = Memory::WriteBarrierPtr<Js::ScriptFunction>::operator->(&this->parentFunc);
  ScriptFunction::SetCachedScope(this_00,(ActivationObjectEx *)0x0);
  return;
}

Assistant:

void ActivationObjectEx::InvalidateCachedScope()
    {
        if (this->cachedFuncCount != 0)
        {
            // Clearing the cached functions and types isn't strictly necessary for correctness,
            // but we want those objects to be collected even if the scope object is part of someone's
            // closure environment.
            memset(this->cache, 0, this->cachedFuncCount * sizeof(FuncCacheEntry));
        }
        this->parentFunc->SetCachedScope(nullptr);
    }